

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mean.hpp
# Opt level: O1

float __thiscall re::math::mean<float,_1l>(math *this,span<const_float,__1L> input)

{
  math *pmVar1;
  float fVar2;
  
  if (0 < (long)this) {
    fVar2 = 0.0;
    pmVar1 = (math *)0x0;
    do {
      fVar2 = fVar2 + *(float *)(input.storage_.super_extent_type<_1L>.size_.size_ +
                                (long)pmVar1 * 4);
      pmVar1 = pmVar1 + 1;
    } while (this != pmVar1);
    return fVar2 / (float)(long)this;
  }
  __assert_fail("std::size(input) > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/reBass[P]libbeatnik/external/reLib/include/re/lib/math/mean.hpp"
                ,0x12,"T re::math::mean(gsl::span<const T, N>) [T = float, N = -1L]");
}

Assistant:

T
mean(gsl::span<T const, N> input)
noexcept
{
    assert(std::size(input) > 0);
    return std::accumulate(
        std::cbegin(input),
        std::cend(input),
        static_cast<T>(0)
    ) / std::size(input);
}